

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall cs::context_type::~context_type(context_type *this)

{
  long in_RDI;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000040;
  
  cs_impl::any::~any((any *)0x22067f);
  std::__cxx11::string::~string((string *)(in_RDI + 0x90));
  std::__cxx11::string::~string((string *)(in_RDI + 0x70));
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(in_stack_00000040);
  std::shared_ptr<cs::instance_type>::~shared_ptr((shared_ptr<cs::instance_type> *)0x2206ba);
  std::shared_ptr<cs::compiler_type>::~shared_ptr((shared_ptr<cs::compiler_type> *)0x2206c4);
  return;
}

Assistant:

~context_type() = default;